

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ustar.c
# Opt level: O3

int format_number(int64_t v,char *p,int s,int maxsize,int strict)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  byte *pbVar4;
  long lVar5;
  
  if (strict == 0) {
    if (s <= maxsize && -1 < v) {
      lVar5 = 1L << ((char)s * '\x03' & 0x3fU);
      do {
        if (v < lVar5) goto LAB_00163729;
        s = s + 1;
        lVar5 = lVar5 << 3;
      } while (maxsize + 1 != s);
    }
    pbVar4 = (byte *)(p + (uint)maxsize);
    if (maxsize < 1) {
      bVar3 = *pbVar4;
    }
    else {
      uVar2 = maxsize + 1;
      do {
        bVar3 = (byte)v;
        pbVar4[-1] = bVar3;
        pbVar4 = pbVar4 + -1;
        v = v >> 8;
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
    }
    *pbVar4 = bVar3 | 0x80;
    return 0;
  }
LAB_00163729:
  iVar1 = format_octal(v,p,s);
  return iVar1;
}

Assistant:

static int
format_number(int64_t v, char *p, int s, int maxsize, int strict)
{
	int64_t limit;

	limit = ((int64_t)1 << (s*3));

	/* "Strict" only permits octal values with proper termination. */
	if (strict)
		return (format_octal(v, p, s));

	/*
	 * In non-strict mode, we allow the number to overwrite one or
	 * more bytes of the field termination.  Even old tar
	 * implementations should be able to handle this with no
	 * problem.
	 */
	if (v >= 0) {
		while (s <= maxsize) {
			if (v < limit)
				return (format_octal(v, p, s));
			s++;
			limit <<= 3;
		}
	}

	/* Base-256 can handle any number, positive or negative. */
	return (format_256(v, p, maxsize));
}